

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool pfederc::logLexerErrors(Logger *log,Lexer *lex)

{
  pointer puVar1;
  Level LVar2;
  bool bVar3;
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  *lexErr;
  pointer puVar4;
  double __x;
  LogMessage msg;
  LogMessage LStack_78;
  
  puVar1 = (lex->errors).
           super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  for (puVar4 = (lex->errors).
                super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    logLexerError(&LStack_78,lex,
                  (puVar4->_M_t).
                  super___uniq_ptr_impl<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                  .super__Head_base<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_false>.
                  _M_head_impl);
    LVar2 = LogMessage::getLogLevel(&LStack_78);
    bVar3 = (bool)(bVar3 | LVar2 == LVL_ERROR);
    LogMessage::log(&LStack_78,__x);
    LogMessage::~LogMessage(&LStack_78);
  }
  return bVar3;
}

Assistant:

bool pfederc::logLexerErrors(Logger &log, const Lexer &lex) noexcept {
  bool result = false;
  for (const auto &lexErr : lex.getErrors()) {
    LogMessage msg = logLexerError(lex, *lexErr);
    if (msg.getLogLevel() == LVL_ERROR)
      result = true;
    msg.log(log);
  }

  return result;
}